

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_match.c
# Opt level: O1

int match_ref(size_t offset,size_t offset_top,PCRE2_SPTR8 eptr,match_block_8 *mb,BOOL caseless,
             size_t *lengthptr)

{
  byte bVar1;
  ushort uVar2;
  ulong uVar3;
  bool bVar4;
  int iVar5;
  size_t sVar6;
  byte *pbVar7;
  byte *pbVar8;
  long lVar9;
  uint *puVar10;
  byte *pbVar11;
  uint uVar12;
  byte *pbVar13;
  byte *pbVar14;
  uint uVar15;
  uint uVar16;
  
  if (offset < offset_top) {
    sVar6 = mb->ovector[offset];
    if (sVar6 != 0xffffffffffffffff) {
      pbVar13 = mb->start_subject + sVar6;
      uVar3 = mb->ovector[offset + 1];
      if (caseless == 0) {
        pbVar7 = eptr + (uVar3 - sVar6);
        lVar9 = 0;
        while (uVar3 - sVar6 != lVar9) {
          pbVar8 = eptr + lVar9;
          if (mb->end_subject <= pbVar8) {
            return 1;
          }
          pbVar11 = pbVar13 + lVar9;
          lVar9 = lVar9 + 1;
          if (*pbVar11 != *pbVar8) {
            return -1;
          }
        }
      }
      else if ((mb->poptions >> 0x13 & 1) == 0) {
        lVar9 = ~uVar3 + sVar6;
        pbVar7 = eptr;
        while (lVar9 = lVar9 + 1, lVar9 != 0) {
          if (pbVar7 < mb->end_subject) {
            if (mb->lcc[*pbVar13] != mb->lcc[*pbVar7]) {
              sVar6 = 0xffffffff;
              goto LAB_00120e85;
            }
            pbVar13 = pbVar13 + 1;
            pbVar7 = pbVar7 + 1;
            bVar4 = true;
          }
          else {
            sVar6 = 1;
LAB_00120e85:
            bVar4 = false;
          }
          if (!bVar4) {
            return (int)sVar6;
          }
        }
      }
      else {
        pbVar11 = mb->start_subject + uVar3;
        pbVar8 = eptr;
        do {
          pbVar14 = pbVar13;
          iVar5 = (int)sVar6;
          pbVar7 = pbVar8;
          if (pbVar11 <= pbVar14) break;
          if (pbVar8 < mb->end_subject) {
            pbVar7 = pbVar8 + 1;
            bVar1 = *pbVar8;
            uVar16 = (uint)bVar1;
            if (0xbf < bVar1) {
              uVar16 = (uint)bVar1;
              if ((bVar1 & 0x20) == 0) {
                pbVar7 = pbVar8 + 2;
                uVar16 = (uVar16 & 0x1f) << 6 | pbVar8[1] & 0x3f;
              }
              else {
                uVar15 = *pbVar7 & 0x3f;
                if ((bVar1 & 0x10) == 0) {
                  uVar16 = pbVar8[2] & 0x3f | uVar15 << 6 | (bVar1 & 0xf) << 0xc;
                  pbVar7 = pbVar8 + 3;
                }
                else if ((bVar1 & 8) == 0) {
                  uVar16 = pbVar8[3] & 0x3f |
                           (pbVar8[2] & 0x3f) << 6 | uVar15 << 0xc | (uVar16 & 7) << 0x12;
                  pbVar7 = pbVar8 + 4;
                }
                else if ((bVar1 & 4) == 0) {
                  uVar16 = (pbVar8[3] & 0x3f) << 6 |
                           (pbVar8[2] & 0x3f) << 0xc | uVar15 << 0x12 | (uVar16 & 3) << 0x18 |
                           pbVar8[4] & 0x3f;
                  pbVar7 = pbVar8 + 5;
                }
                else {
                  uVar16 = pbVar8[5] & 0x3f |
                           (pbVar8[4] & 0x3f) << 6 |
                           (pbVar8[3] & 0x3f) << 0xc |
                           (pbVar8[2] & 0x3f) << 0x12 | uVar15 << 0x18 | (bVar1 & 1) << 0x1e;
                  pbVar7 = pbVar8 + 6;
                }
              }
            }
            pbVar13 = pbVar14 + 1;
            bVar1 = *pbVar14;
            uVar15 = (uint)bVar1;
            if (0xbf < bVar1) {
              uVar15 = (uint)bVar1;
              if ((bVar1 & 0x20) == 0) {
                pbVar13 = pbVar14 + 2;
                uVar15 = (uVar15 & 0x1f) << 6 | pbVar14[1] & 0x3f;
              }
              else {
                uVar12 = *pbVar13 & 0x3f;
                if ((bVar1 & 0x10) == 0) {
                  uVar15 = pbVar14[2] & 0x3f | uVar12 << 6 | (bVar1 & 0xf) << 0xc;
                  pbVar13 = pbVar14 + 3;
                }
                else if ((bVar1 & 8) == 0) {
                  uVar15 = pbVar14[3] & 0x3f |
                           (pbVar14[2] & 0x3f) << 6 | uVar12 << 0xc | (uVar15 & 7) << 0x12;
                  pbVar13 = pbVar14 + 4;
                }
                else if ((bVar1 & 4) == 0) {
                  uVar15 = (pbVar14[3] & 0x3f) << 6 |
                           (pbVar14[2] & 0x3f) << 0xc | uVar12 << 0x12 | (uVar15 & 3) << 0x18 |
                           pbVar14[4] & 0x3f;
                  pbVar13 = pbVar14 + 5;
                }
                else {
                  uVar15 = pbVar14[5] & 0x3f |
                           (pbVar14[4] & 0x3f) << 6 |
                           (pbVar14[3] & 0x3f) << 0xc |
                           (pbVar14[2] & 0x3f) << 0x12 | uVar12 << 0x18 | (bVar1 & 1) << 0x1e;
                  pbVar13 = pbVar14 + 6;
                }
              }
            }
            bVar4 = true;
            if ((uVar16 != uVar15) &&
               (uVar2 = *(ushort *)
                         ((long)_pcre2_ucd_stage2_8 +
                         (ulong)((uint)""[uVar15 >> 7] * 0x100 + (uVar15 & 0x7f) * 2)),
               uVar16 != uVar15 + _pcre2_ucd_records_8[uVar2].other_case)) {
              puVar10 = _pcre2_ucd_caseless_sets_8 + _pcre2_ucd_records_8[uVar2].caseset;
              do {
                uVar15 = *puVar10;
                bVar4 = uVar16 >= uVar15;
                if (uVar16 < uVar15) {
                  sVar6 = 0xffffffff;
                  break;
                }
                puVar10 = puVar10 + 1;
              } while (uVar16 != uVar15);
            }
          }
          else {
            sVar6 = 1;
            bVar4 = false;
            pbVar13 = pbVar14;
          }
          iVar5 = (int)sVar6;
          pbVar8 = pbVar7;
        } while (bVar4);
        if (pbVar14 < pbVar11) {
          return iVar5;
        }
      }
      sVar6 = (long)pbVar7 - (long)eptr;
      goto LAB_001211c4;
    }
  }
  if ((mb->poptions >> 9 & 1) == 0) {
    return -1;
  }
  sVar6 = 0;
LAB_001211c4:
  *lengthptr = sVar6;
  return 0;
}

Assistant:

static int
match_ref(PCRE2_SIZE offset, PCRE2_SIZE offset_top, register PCRE2_SPTR eptr,
  match_block *mb, BOOL caseless, PCRE2_SIZE *lengthptr)
{
#if defined SUPPORT_UNICODE
BOOL utf = (mb->poptions & PCRE2_UTF) != 0;
#endif

register PCRE2_SPTR p;
PCRE2_SIZE length;
PCRE2_SPTR eptr_start = eptr;

/* Deal with an unset group. The default is no match, but there is an option to
match an empty string. */

if (offset >= offset_top || mb->ovector[offset] == PCRE2_UNSET)
  {
  if ((mb->poptions & PCRE2_MATCH_UNSET_BACKREF) != 0)
    {
    *lengthptr = 0;
    return 0;      /* Match */
    }
  else return -1;  /* No match */
  }

/* Separate the caseless and UTF cases for speed. */

p = mb->start_subject + mb->ovector[offset];
length = mb->ovector[offset+1] - mb->ovector[offset];

if (caseless)
  {
#if defined SUPPORT_UNICODE
  if (utf)
    {
    /* Match characters up to the end of the reference. NOTE: the number of
    code units matched may differ, because in UTF-8 there are some characters
    whose upper and lower case versions code have different numbers of bytes.
    For example, U+023A (2 bytes in UTF-8) is the upper case version of U+2C65
    (3 bytes in UTF-8); a sequence of 3 of the former uses 6 bytes, as does a
    sequence of two of the latter. It is important, therefore, to check the
    length along the reference, not along the subject (earlier code did this
    wrong). */

    PCRE2_SPTR endptr = p + length;
    while (p < endptr)
      {
      uint32_t c, d;
      const ucd_record *ur;
      if (eptr >= mb->end_subject) return 1;   /* Partial match */
      GETCHARINC(c, eptr);
      GETCHARINC(d, p);
      ur = GET_UCD(d);
      if (c != d && c != d + ur->other_case)
        {
        const uint32_t *pp = PRIV(ucd_caseless_sets) + ur->caseset;
        for (;;)
          {
          if (c < *pp) return -1;  /* No match */
          if (c == *pp++) break;
          }
        }
      }
    }
  else
#endif

    /* Not in UTF mode */

    {
    while (length-- > 0)
      {
      uint32_t cc, cp;
      if (eptr >= mb->end_subject) return 1;   /* Partial match */
      cc = UCHAR21TEST(eptr);
      cp = UCHAR21TEST(p);
      if (TABLE_GET(cp, mb->lcc, cp) != TABLE_GET(cc, mb->lcc, cc))
        return -1;  /* No match */
      p++;
      eptr++;
      }
    }
  }

/* In the caseful case, we can just compare the code units, whether or not we
are in UT mode. */

else
  {
  while (length-- > 0)
    {
    if (eptr >= mb->end_subject) return 1;   /* Partial match */
    if (UCHAR21INCTEST(p) != UCHAR21INCTEST(eptr)) return -1;  /*No match */
    }
  }

*lengthptr = eptr - eptr_start;
return 0;  /* Match */
}